

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O2

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *
IndexTools::CalculateStepSizeVector
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__return_storage_ptr__,
          vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *nrElems)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  allocator_type local_21;
  
  lVar3 = (long)(nrElems->
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(nrElems->
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (__return_storage_ptr__,lVar3 >> 3,&local_21);
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *(undefined8 *)((long)puVar1 + lVar3 + -8) = 1;
  if (lVar3 != 8) {
    puVar2 = (nrElems->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar4 = (ulong)((int)(lVar3 >> 3) - 2) + 1; uVar4 != 1; uVar4 = uVar4 - 1) {
      puVar1[uVar4 - 1] = puVar1[uVar4 & 0xffffffff] * puVar2[uVar4 & 0xffffffff];
    }
    *puVar1 = puVar1[1] *
              (nrElems->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)
              ._M_impl.super__Vector_impl_data._M_start[1];
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LIndex> IndexTools::CalculateStepSizeVector(const vector<LIndex>& nrElems)
{
    size_t vec_size = nrElems.size();
    //increment indicates for each agent how many the joint index is
    //incremented to get the next individual action...
    vector<LIndex> step_size(vec_size);
    //the step_size for the last agent is 1
    step_size[vec_size-1] = 1;
    if(vec_size != 1)
    {
        Index i = vec_size-2;
        while(1)
        {
            if(i>0)
            {
                step_size[i] = nrElems[i+1] * step_size[i+1];
                i--;
            }
            else if(i==0)
            {
                step_size[i] = nrElems[i+1] * step_size[i+1];
                break;
            }
        }
    }
    return(step_size);
}